

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O1

bool __thiscall mnf::Manifold::isInM(Manifold *this,VectorXd *val,double prec)

{
  long lVar1;
  int iVar2;
  Index IVar3;
  undefined8 uVar4;
  
  if ((this->super_ValidManifold).flag_ == 0x677d7257) {
    lVar1 = (val->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    IVar3 = representationDim(this);
    if (lVar1 == IVar3) {
      iVar2 = (*this->_vptr_Manifold[0xd])(prec,this,val);
      return SUB41(iVar2,0);
    }
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&mnf_exception::typeinfo,0);
}

Assistant:

bool Manifold::isInM(const Eigen::VectorXd& val, double prec) const
{
  mnf_assert(isValid() || seeMessageAbove());
  mnf_assert(val.size() == representationDim());
  return isInM_(val, prec);
}